

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_alternative_serial.cpp
# Opt level: O2

void test_dump(void)

{
  int answer;
  allocator<char> local_5d;
  int local_5c;
  string local_58;
  string local_38;
  
  SpyingSerial::clear(&Serial2);
  local_5c = 0x2a;
  std::operator<<((ostream *)&Serial2.field_0x10,"test_alternative_serial.cpp");
  std::operator<<((ostream *)&Serial2.field_0x10,":24: answer = ");
  SpyingSerial::println<int>(&Serial2,&local_5c);
  SpyingSerial::flush(&Serial2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"test_alternative_serial.cpp:\\d+: answer = 42\r\nflush\\(\\)\r\n",
             &local_5d);
  ASSERT_RE(&local_38,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void test_dump() {
  Serial2.clear();
  int answer = 42;
  DUMP(answer);
  ASSERT_RE(Serial2.log(),
            "test_alternative_serial.cpp:\\d+: answer = 42\r\n"
            "flush\\(\\)\r\n");
}